

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreevent.h
# Opt level: O1

void __thiscall PressDelayHandler::timerEvent(PressDelayHandler *this,QTimerEvent *e)

{
  QMouseEvent *pQVar1;
  Data *pDVar2;
  
  if (*(TimerId *)(e + 0x10) == (this->pressDelayTimer).m_id) {
    pQVar1 = (this->pressDelayEvent).d;
    if ((((pQVar1 != (QMouseEvent *)0x0) &&
         (pDVar2 = (this->mouseTarget).wp.d, pDVar2 != (Data *)0x0)) && (*(int *)(pDVar2 + 4) != 0))
       && ((this->mouseTarget).wp.value != (QObject *)0x0)) {
      sendMouseEvent(this,pQVar1,1);
    }
    pQVar1 = (this->pressDelayEvent).d;
    if (pQVar1 != (QMouseEvent *)0x0) {
      (this->pressDelayEvent).d = (QMouseEvent *)0x0;
      (**(code **)(*(long *)pQVar1 + 8))();
    }
    if ((this->pressDelayTimer).m_id != Invalid) {
      QBasicTimer::stop();
      return;
    }
  }
  return;
}

Assistant:

Qt::TimerId id() const { return m_id; }